

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

int Search::random_policy
              (search_private *priv,bool allow_current,bool allow_optimal,bool advance_prng)

{
  float fVar1;
  uint32_t uVar2;
  ostream *poVar3;
  uint64_t *puVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  
  uVar2 = priv->current_policy;
  if (1.0 <= priv->beta) {
    if (allow_current) {
      return uVar2;
    }
    if (uVar2 != 0) {
      return uVar2 - 1;
    }
    if (!allow_optimal) {
LAB_0021a145:
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "internal error (bug): no valid policies to choose from!  defaulting to current"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      return priv->current_policy;
    }
  }
  else {
    iVar5 = (uint)allow_optimal + (uint)allow_current + uVar2;
    if (iVar5 == 2) {
      puVar4 = &priv->all->random_state;
      if (advance_prng) {
        fVar7 = merand48(puVar4);
      }
      else {
        fVar7 = merand48_noadvance(*puVar4);
      }
      uVar6 = (uint)(priv->beta <= fVar7);
    }
    else {
      uVar6 = 0;
      if (iVar5 != 1) {
        if (iVar5 == 0) goto LAB_0021a145;
        puVar4 = &priv->all->random_state;
        if (advance_prng) {
          fVar7 = merand48(puVar4);
        }
        else {
          fVar7 = merand48_noadvance(*puVar4);
        }
        if (priv->beta < fVar7) {
          fVar7 = fVar7 - priv->beta;
          uVar6 = 0;
          while ((0.0 < fVar7 && ((int)uVar6 < iVar5 + -1))) {
            uVar6 = uVar6 + 1;
            fVar1 = priv->beta;
            fVar8 = powf(1.0 - fVar1,(float)(int)uVar6);
            fVar7 = fVar7 - fVar8 * fVar1;
          }
        }
      }
    }
    if ((!allow_optimal) || (uVar6 != iVar5 - 1U)) {
      return ~uVar6 + (uint)allow_current + priv->current_policy;
    }
  }
  return -1;
}

Assistant:

int random_policy(search_private& priv, bool allow_current, bool allow_optimal, bool advance_prng = true)
{
  if (priv.beta >= 1)
  {
    if (allow_current)
      return (int)priv.current_policy;
    if (priv.current_policy > 0)
      return (((int)priv.current_policy) - 1);
    if (allow_optimal)
      return -1;
    std::cerr << "internal error (bug): no valid policies to choose from!  defaulting to current" << std::endl;
    return (int)priv.current_policy;
  }

  int num_valid_policies = (int)priv.current_policy + allow_optimal + allow_current;
  int pid = -1;

  if (num_valid_policies == 0)
  {
    std::cerr << "internal error (bug): no valid policies to choose from!  defaulting to current" << std::endl;
    return (int)priv.current_policy;
  }
  else if (num_valid_policies == 1)
    pid = 0;
  else if (num_valid_policies == 2)
    pid = (advance_prng ? merand48(priv.all->random_state) : merand48_noadvance(priv.all->random_state)) >= priv.beta;
  else
  {
    // SPEEDUP this up in the case that beta is small!
    float r = (advance_prng ? merand48(priv.all->random_state) : merand48_noadvance(priv.all->random_state));
    pid = 0;

    if (r > priv.beta)
    {
      r -= priv.beta;
      while ((r > 0) && (pid < num_valid_policies - 1))
      {
        pid++;
        r -= priv.beta * powf(1.f - priv.beta, (float)pid);
      }
    }
  }
  // figure out which policy pid refers to
  if (allow_optimal && (pid == num_valid_policies - 1))
    return -1;  // this is the optimal policy

  pid = (int)priv.current_policy - pid;
  if (!allow_current)
    pid--;

  return pid;
}